

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  pointer *pppcVar1;
  iterator __position;
  size_type sVar2;
  KindedSources *pKVar3;
  pointer __args;
  string local_50;
  
  pKVar3 = GetKindedSources(this,config);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
            (files,(long)(pKVar3->Sources).
                         super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pKVar3->Sources).
                         super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  __args = (pKVar3->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__args != (pKVar3->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_50,__args->Source);
      sVar2 = local_50._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (sVar2 == 0) {
        __position._M_current =
             (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
          _M_realloc_insert<cmSourceFile*const&>
                    ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)files,__position,
                     &__args->Source);
        }
        else {
          *__position._M_current = __args->Source;
          pppcVar1 = &(files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      __args = __args + 1;
    } while (__args != (pKVar3->Sources).
                       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::vector<cmSourceFile*>& files, const std::string& config) const
{
  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (std::vector<SourceAndKind>::const_iterator si = kinded.Sources.begin();
       si != kinded.Sources.end(); ++si) {
    if (si->Source->GetObjectLibrary().empty()) {
      files.push_back(si->Source);
    }
  }
}